

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O1

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::SetNrAgents::operator()
          (SetNrAgents *this,iterator_t first,iterator_t last)

{
  uint uVar1;
  ParserDPOMDPFormat_Spirit *pPVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  stringstream msg;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  pPVar2 = this->_m_po;
  if (pPVar2->_m_lp_type == UINT) {
    uVar1 = pPVar2->_m_lp_uint;
    MultiAgentDecisionProcess::SetNrAgents
              ((MultiAgentDecisionProcess *)pPVar2->_m_decPOMDPDiscrete,(ulong)uVar1);
    this->_m_po->_m_nrA = (ulong)uVar1;
    return;
  }
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,
             "SetNrAgents::operator()(iterator_t first, iterator_t last) requires that last parsed element is a UINT!"
             ,0x67);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"(at ",4);
  poVar3 = DPOMDPFormatParsing::operator<<(local_188,&this->_m_po->_m_first->_pos);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::endl<char,std::char_traits<char>>(poVar3);
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar4 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  *puVar4 = &PTR__E_005ce150;
  __cxa_throw(puVar4,&EParse::typeinfo,E::~E);
}

Assistant:

void ParserDPOMDPFormat_Spirit::SetNrAgents::operator()(iterator_t first, iterator_t last) const
{    
    if (_m_po->_m_lp_type != UINT)
    {
        stringstream msg;
        msg << "SetNrAgents::operator()(iterator_t first, iterator_t last) requires that last parsed element is a UINT!"<<
            "(at " << _m_po->_m_first->get_position() << ")" << endl;
        throw EParse(msg);
    }
    size_t nrA = _m_po->_m_lp_uint;
    if(DEBUG_PARSE){cout <<"agt_SetNrAgents - nrA="<<nrA<<endl;} 
    _m_po->GetDecPOMDPDiscrete()->SetNrAgents(nrA);
    _m_po->_m_nrA = nrA;
}